

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O3

void Cgt_ManCollectVisited_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Ptr_t *vVisited)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  
  uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
  if (((uVar2 & 7) != 2) && (pObj->TravId != pAig->nTravIds)) {
    pObj->TravId = pAig->nTravIds;
    if ((uVar2 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtAig.c"
                    ,0x9e,"void Cgt_ManCollectVisited_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    Cgt_ManCollectVisited_rec
              (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vVisited);
    Cgt_ManCollectVisited_rec
              (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vVisited);
    uVar2 = vVisited->nSize;
    if (uVar2 == vVisited->nCap) {
      if ((int)uVar2 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar3;
        vVisited->nCap = 0x10;
      }
      else {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vVisited->pArray,(ulong)uVar2 << 4);
        }
        vVisited->pArray = ppvVar3;
        vVisited->nCap = uVar2 * 2;
      }
    }
    else {
      ppvVar3 = vVisited->pArray;
    }
    iVar1 = vVisited->nSize;
    vVisited->nSize = iVar1 + 1;
    ppvVar3[iVar1] = pObj;
  }
  return;
}

Assistant:

void Cgt_ManCollectVisited_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Ptr_t * vVisited )
{
    if ( Aig_ObjIsCi(pObj) )
        return;
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    assert( Aig_ObjIsNode(pObj) );
    Cgt_ManCollectVisited_rec( pAig, Aig_ObjFanin0(pObj), vVisited );
    Cgt_ManCollectVisited_rec( pAig, Aig_ObjFanin1(pObj), vVisited );
    Vec_PtrPush( vVisited, pObj );
}